

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

_Bool check_noproxy(char *name,char *no_proxy)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  char *checkn;
  char *endptr;
  size_t namelen;
  size_t no_proxy_len;
  char *separator;
  size_t tok_end;
  size_t tok_start;
  char *no_proxy_local;
  char *name_local;
  
  if ((no_proxy != (char *)0x0) && (*no_proxy != '\0')) {
    iVar1 = Curl_strcasecompare("*",no_proxy);
    if (iVar1 != 0) {
      return true;
    }
    pcVar2 = (char *)strlen(no_proxy);
    if (*name == '[') {
      pcVar3 = strchr(name,0x5d);
      if (pcVar3 == (char *)0x0) {
        return false;
      }
      no_proxy_local = name + 1;
      endptr = pcVar3 + -(long)no_proxy_local;
    }
    else {
      endptr = (char *)strlen(name);
      no_proxy_local = name;
    }
    tok_end = 0;
    while (tok_end < pcVar2) {
      while( true ) {
        bVar4 = false;
        if (tok_end < pcVar2) {
          pcVar3 = strchr(", ",(int)no_proxy[tok_end]);
          bVar4 = pcVar3 != (char *)0x0;
        }
        if (!bVar4) break;
        tok_end = tok_end + 1;
      }
      if ((char *)tok_end == pcVar2) {
        return false;
      }
      separator = (char *)tok_end;
      while( true ) {
        bVar4 = false;
        if (separator < pcVar2) {
          pcVar3 = strchr(", ",(int)no_proxy[(long)separator]);
          bVar4 = pcVar3 == (char *)0x0;
        }
        if (!bVar4) break;
        separator = separator + 1;
      }
      if (no_proxy[tok_end] == '.') {
        tok_end = tok_end + 1;
      }
      if (separator + -tok_end <= endptr) {
        iVar1 = Curl_strncasecompare
                          (no_proxy + tok_end,
                           no_proxy_local + (long)endptr + -((long)separator - tok_end),
                           (long)separator - tok_end);
        if ((iVar1 != 0) &&
           ((separator + -tok_end == endptr ||
            ((no_proxy_local + (long)endptr + -((long)separator - tok_end))[-1] == '.')))) {
          return true;
        }
      }
      tok_end = (size_t)(separator + 1);
    }
  }
  return false;
}

Assistant:

static bool check_noproxy(const char *name, const char *no_proxy)
{
  /* no_proxy=domain1.dom,host.domain2.dom
   *   (a comma-separated list of hosts which should
   *   not be proxied, or an asterisk to override
   *   all proxy variables)
   */
  if(no_proxy && no_proxy[0]) {
    size_t tok_start;
    size_t tok_end;
    const char *separator = ", ";
    size_t no_proxy_len;
    size_t namelen;
    char *endptr;
    if(strcasecompare("*", no_proxy)) {
      return TRUE;
    }

    /* NO_PROXY was specified and it wasn't just an asterisk */

    no_proxy_len = strlen(no_proxy);
    if(name[0] == '[') {
      /* IPv6 numerical address */
      endptr = strchr(name, ']');
      if(!endptr)
        return FALSE;
      name++;
      namelen = endptr - name;
    }
    else
      namelen = strlen(name);

    for(tok_start = 0; tok_start < no_proxy_len; tok_start = tok_end + 1) {
      while(tok_start < no_proxy_len &&
            strchr(separator, no_proxy[tok_start]) != NULL) {
        /* Look for the beginning of the token. */
        ++tok_start;
      }

      if(tok_start == no_proxy_len)
        break; /* It was all trailing separator chars, no more tokens. */

      for(tok_end = tok_start; tok_end < no_proxy_len &&
            strchr(separator, no_proxy[tok_end]) == NULL; ++tok_end)
        /* Look for the end of the token. */
        ;

      /* To match previous behaviour, where it was necessary to specify
       * ".local.com" to prevent matching "notlocal.com", we will leave
       * the '.' off.
       */
      if(no_proxy[tok_start] == '.')
        ++tok_start;

      if((tok_end - tok_start) <= namelen) {
        /* Match the last part of the name to the domain we are checking. */
        const char *checkn = name + namelen - (tok_end - tok_start);
        if(strncasecompare(no_proxy + tok_start, checkn,
                           tok_end - tok_start)) {
          if((tok_end - tok_start) == namelen || *(checkn - 1) == '.') {
            /* We either have an exact match, or the previous character is a .
             * so it is within the same domain, so no proxy for this host.
             */
            return TRUE;
          }
        }
      } /* if((tok_end - tok_start) <= namelen) */
    } /* for(tok_start = 0; tok_start < no_proxy_len;
         tok_start = tok_end + 1) */
  } /* NO_PROXY was specified and it wasn't just an asterisk */

  return FALSE;
}